

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::clear(Heap<Gluco::SimpSolver::ElimLt> *this,bool dealloc)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  piVar1 = (this->heap).data;
  piVar2 = (this->indices).data;
  for (lVar3 = 0; lVar3 < (this->heap).sz; lVar3 = lVar3 + 1) {
    piVar2[piVar1[lVar3]] = -1;
  }
  vec<int>::clear(&this->heap,dealloc);
  return;
}

Assistant:

void clear(bool dealloc = false) 
    { 
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dealloc); 
    }